

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

int __thiscall Fl_Menu_::copy(Fl_Menu_ *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Fl_Menu_Item *local_30;
  Fl_Menu_Item *newMenu;
  int n;
  void *ud_local;
  Fl_Menu_Item *m_local;
  Fl_Menu_ *this_local;
  
  newMenu._4_4_ = Fl_Menu_Item::size((Fl_Menu_Item *)dst);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)newMenu._4_4_;
  uVar2 = SUB168(auVar1 * ZEXT816(0x38),0);
  if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_30 = (Fl_Menu_Item *)operator_new__(uVar2);
  memcpy(local_30,dst,(long)(int)newMenu._4_4_ * 0x38);
  menu(this,local_30);
  this->alloc = '\x01';
  if (src != (EVP_PKEY_CTX *)0x0) {
    while( true ) {
      this = (Fl_Menu_ *)(ulong)newMenu._4_4_;
      if (newMenu._4_4_ == 0) break;
      if (local_30->callback_ != (Fl_Callback *)0x0) {
        local_30->user_data_ = src;
      }
      local_30 = local_30 + 1;
      newMenu._4_4_ = newMenu._4_4_ - 1;
    }
  }
  return (int)this;
}

Assistant:

void Fl_Menu_::copy(const Fl_Menu_Item* m, void* ud) {
  int n = m->size();
  Fl_Menu_Item* newMenu = new Fl_Menu_Item[n];
  memcpy(newMenu, m, n*sizeof(Fl_Menu_Item));
  menu(newMenu);
  alloc = 1; // make destructor free array, but not strings
  // for convenience, provide way to change all the user data pointers:
  if (ud) for (; n--;) {
    if (newMenu->callback_) newMenu->user_data_ = ud;
    newMenu++;
  }
}